

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

void event_base_dump_events(event_base *base,FILE *output)

{
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  fwrite("Inserted events:\n",0x11,1,(FILE *)output);
  event_base_foreach_event_nolock_(base,dump_inserted_event_fn,output);
  fwrite("Active events:\n",0xf,1,(FILE *)output);
  event_base_foreach_event_nolock_(base,dump_active_event_fn,output);
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
    return;
  }
  return;
}

Assistant:

void
event_base_dump_events(struct event_base *base, FILE *output)
{
	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	fprintf(output, "Inserted events:\n");
	event_base_foreach_event_nolock_(base, dump_inserted_event_fn, output);

	fprintf(output, "Active events:\n");
	event_base_foreach_event_nolock_(base, dump_active_event_fn, output);
	EVBASE_RELEASE_LOCK(base, th_base_lock);
}